

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Thermo::getSystemDipole(Thermo *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  AtomType *pAVar2;
  undefined8 *in_RSI;
  Snapshot *in_RDI;
  RealType RVar3;
  RealType chg_value;
  Vector3d boxDipole;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  RealType debyeToCm;
  RealType angstromToM;
  RealType chargeToC;
  int pCount;
  int nCount;
  RealType pChg;
  RealType nChg;
  Vector3d pPos;
  Vector3d nPos;
  Vector3d dipoleVector;
  Vector3d ri;
  RealType charge;
  Atom *atom;
  Molecule *mol;
  iterator aiter;
  MoleculeIterator miter;
  Snapshot *snap;
  Snapshot *in_stack_fffffffffffffde8;
  Snapshot *this_01;
  iterator *in_stack_fffffffffffffe08;
  SimInfo *in_stack_fffffffffffffe10;
  Vector3d *in_stack_fffffffffffffe68;
  Snapshot *in_stack_fffffffffffffe70;
  FluctuatingChargeAdapter local_160;
  FixedChargeAdapter local_158;
  undefined8 local_150;
  undefined8 local_148;
  double local_140;
  int local_138;
  int local_134;
  Snapshot *local_130;
  Snapshot *local_128;
  double local_120;
  Vector<double,_3U> local_118 [2];
  double local_e8;
  Vector<double,_3U> local_e0 [2];
  double local_b0;
  Vector<double,_3U> local_a8 [2];
  double local_78;
  Vector<double,_3U> local_70 [2];
  RealType local_40;
  Atom *local_38;
  Molecule *local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  Snapshot *local_18;
  
  this_01 = in_RDI;
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  local_18 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_18->hasSystemDipole & 1U) == 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_28);
    local_78 = 0.0;
    Vector<double,_3U>::Vector(local_70,&local_78);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde8);
    local_b0 = 0.0;
    Vector<double,_3U>::Vector(local_a8,&local_b0);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde8);
    local_e8 = 0.0;
    Vector<double,_3U>::Vector(local_e0,&local_e8);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde8);
    local_120 = 0.0;
    Vector<double,_3U>::Vector(local_118,&local_120);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde8);
    local_128 = (Snapshot *)0x0;
    local_130 = (Snapshot *)0x0;
    local_134 = 0;
    local_138 = 0;
    local_140 = 1.60217733e-19;
    local_148 = 0x3ddb7cdfd9d7bdbb;
    local_150 = 0x39d0e9e8d595a487;
    local_30 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffe10,(MoleculeIterator *)in_stack_fffffffffffffe08);
    while (local_30 != (Molecule *)0x0) {
      local_38 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
                                    );
      while (local_38 != (Atom *)0x0) {
        local_40 = 0.0;
        pAVar2 = Atom::getAtomType(local_38);
        FixedChargeAdapter::FixedChargeAdapter(&local_158,pAVar2);
        bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x17033f);
        if (bVar1) {
          local_40 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_RDI);
        }
        pAVar2 = Atom::getAtomType(local_38);
        FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_160,pAVar2);
        bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x170385);
        if (bVar1) {
          RVar3 = StuntDouble::getFlucQPos((StuntDouble *)in_RDI);
          local_40 = RVar3 + local_40;
        }
        local_40 = local_140 * local_40;
        StuntDouble::getPos((StuntDouble *)this_01);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffde8);
        Snapshot::wrapVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        Vector<double,_3U>::operator*=
                  ((Vector<double,_3U> *)in_RDI,(double)in_stack_fffffffffffffde8);
        if (0.0 <= local_40) {
          if (0.0 < local_40) {
            Vector<double,_3U>::operator+=
                      ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde8)
            ;
            local_130 = (Snapshot *)(local_40 + (double)local_130);
            local_138 = local_138 + 1;
          }
        }
        else {
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde8);
          local_128 = (Snapshot *)((double)local_128 - local_40);
          local_134 = local_134 + 1;
        }
        bVar1 = Atom::isDipole((Atom *)0x1704d1);
        if (bVar1) {
          StuntDouble::getDipole((StuntDouble *)this_01);
          OpenMD::operator*((Vector<double,_3U> *)this_01,(double)in_RDI);
          Vector<double,_3U>::operator+=
                    ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde8);
        }
        local_38 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffe10,
                                      in_stack_fffffffffffffe08);
      }
      local_30 = SimInfo::nextMolecule
                           (in_stack_fffffffffffffe10,(MoleculeIterator *)in_stack_fffffffffffffe08)
      ;
    }
    Vector3<double>::Vector3((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_fffffffffffffde8)
    ;
    in_stack_fffffffffffffde8 = local_130;
    if ((double)local_128 <= (double)local_130) {
      in_stack_fffffffffffffde8 = local_128;
    }
    if ((0 < local_138) && (0 < local_134)) {
      Vector<double,_3U>::operator/=((Vector<double,_3U> *)in_RDI,(double)in_stack_fffffffffffffde8)
      ;
      Vector<double,_3U>::operator/=((Vector<double,_3U> *)in_RDI,(double)in_stack_fffffffffffffde8)
      ;
    }
    OpenMD::operator-((Vector<double,_3U> *)this_01,(Vector<double,_3U> *)in_RDI);
    OpenMD::operator*((Vector<double,_3U> *)this_01,(double)in_RDI);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde8);
    Snapshot::setSystemDipole(in_RDI,(Vector3d *)in_stack_fffffffffffffde8);
  }
  Snapshot::getSystemDipole(in_stack_fffffffffffffde8);
  return (Vector3d *)this_01;
}

Assistant:

Vector3d Thermo::getSystemDipole() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasSystemDipole) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      Vector3d ri(0.0);
      Vector3d dipoleVector(0.0);
      Vector3d nPos(0.0);
      Vector3d pPos(0.0);
      RealType nChg(0.0);
      RealType pChg(0.0);
      int nCount = 0;
      int pCount = 0;

      RealType chargeToC   = 1.60217733e-19;
      RealType angstromToM = 1.0e-10;
      RealType debyeToCm   = 3.33564095198e-30;

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          charge *= chargeToC;

          ri = atom->getPos();
          snap->wrapVector(ri);
          ri *= angstromToM;

          if (charge < 0.0) {
            nPos += ri;
            nChg -= charge;
            nCount++;
          } else if (charge > 0.0) {
            pPos += ri;
            pChg += charge;
            pCount++;
          }

          if (atom->isDipole()) {
            dipoleVector += atom->getDipole() * debyeToCm;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &pChg, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &nChg, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, &pCount, 1, MPI_INTEGER, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &nCount, 1, MPI_INTEGER, MPI_SUM,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, pPos.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, nPos.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, dipoleVector.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      // first load the accumulated dipole moment (if dipoles were present)
      Vector3d boxDipole = dipoleVector;
      // now include the dipole moment due to charges
      // use the lesser of the positive and negative charge totals
      RealType chg_value = nChg <= pChg ? nChg : pChg;

      // find the average positions
      if (pCount > 0 && nCount > 0) {
        pPos /= pCount;
        nPos /= nCount;
      }

      // dipole is from the negative to the positive (physics notation)
      boxDipole += (pPos - nPos) * chg_value;
      snap->setSystemDipole(boxDipole);
    }

    return snap->getSystemDipole();
  }